

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O2

bool __thiscall Core::error(Core *this,string *s,bool b)

{
  ostream *poVar1;
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,b) != 0) {
    std::operator<<((ostream *)&std::cerr,
                    "\x1b[1;31mReclone the repo is recommended if you\'re missing ressources (rsrc)!\x1b[0m\n"
                   );
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"\x1b[1;31m");
  poVar1 = std::operator<<(poVar1,(string *)s);
  std::operator<<(poVar1,anon_var_dwarf_9543);
  return false;
}

Assistant:

bool Core::error(const std::string &s, bool b) const
{
    if (b)
        std::cerr << "\033[1;31mReclone the repo is recommended if you're missing ressources (rsrc)!\033[0m\n";
    std::cerr << "\033[1;31m" << s << " è_é\033[0m\n";
    return false;
}